

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

uchar __thiscall v128::To<unsigned_char>(v128 *this,int lane)

{
  if (lane + 1U < 0x11) {
    return this->v[lane];
  }
  __assert_fail("(lane + 1) * sizeof(T) <= sizeof(v)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/common.h"
                ,0x8f,"T v128::To(int) const [T = unsigned char]");
}

Assistant:

T To(int lane) const {
    static_assert(sizeof(T) <= sizeof(v), "Invalid cast!");
    assert((lane + 1) * sizeof(T) <= sizeof(v));
    T result;
    wabt::MemcpyEndianAware(&result, v, sizeof(result), sizeof(v), 0,
                            lane * sizeof(T), sizeof(result));
    return result;
  }